

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O1

void __thiscall
QPixmapConvolutionFilter::setConvolutionKernel
          (QPixmapConvolutionFilter *this,qreal *kernel,int rows,int columns)

{
  long lVar1;
  void *__dest;
  ulong uVar2;
  
  lVar1 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  if (*(void **)(lVar1 + 0x80) != (void *)0x0) {
    operator_delete__(*(void **)(lVar1 + 0x80));
  }
  uVar2 = 0xffffffffffffffff;
  if (-1 < columns * rows) {
    uVar2 = (long)(columns * rows) * 8;
  }
  __dest = operator_new__(uVar2);
  *(void **)(lVar1 + 0x80) = __dest;
  memcpy(__dest,kernel,(long)rows * (long)columns * 8);
  *(int *)(lVar1 + 0x88) = columns;
  *(int *)(lVar1 + 0x8c) = rows;
  return;
}

Assistant:

void QPixmapConvolutionFilter::setConvolutionKernel(const qreal *kernel, int rows, int columns)
{
    Q_D(QPixmapConvolutionFilter);
    delete [] d->convolutionKernel;
    d->convolutionKernel = new qreal[rows * columns];
    memcpy(d->convolutionKernel, kernel, sizeof(qreal) * rows * columns);
    d->kernelWidth = columns;
    d->kernelHeight = rows;
}